

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagBuilder.cpp
# Opt level: O3

DiagBuilder * __thiscall Mond::DiagBuilder::operator<<(DiagBuilder *this,DiagSentinel b)

{
  undefined8 uVar1;
  undefined8 *local_78;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined8 local_68;
  undefined1 *local_60;
  undefined8 local_58;
  undefined1 local_50 [16];
  undefined8 local_40;
  string *local_38;
  
  WriteRest(this);
  std::__cxx11::stringbuf::str();
  local_38 = (string *)&(this->m_diag).message;
  std::__cxx11::string::operator=(local_38,(string *)&local_78);
  if (local_78 != &local_68) {
    operator_delete(local_78);
  }
  if ((this->m_func).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->m_func)._M_invoker)((_Any_data *)&this->m_func,&this->m_diag);
    this->m_pos = 0;
    this->m_fmt = (char *)0x0;
    local_78 = &local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
    std::__cxx11::stringbuf::str((string *)&this->field_0x68);
    if (local_78 != &local_68) {
      operator_delete(local_78);
    }
    local_40 = 0;
    local_50 = (undefined1  [16])0x0;
    local_78 = (undefined8 *)0xffffffffffffffff;
    uStack_70 = 0xffffffff;
    uStack_6c = 0xffffffff;
    local_68 = 0xffffffffffffffff;
    local_58 = 0;
    (this->m_diag).range.end.line = -1;
    (this->m_diag).range.end.column = -1;
    (this->m_diag).caret.line = -1;
    (this->m_diag).caret.column = -1;
    (this->m_diag).range.beg.line = -1;
    (this->m_diag).range.beg.column = -1;
    local_60 = local_50;
    std::__cxx11::string::operator=(local_38,(string *)&local_60);
    (this->m_diag).severity = (undefined4)local_40;
    (this->m_diag).messageId = local_40._4_4_;
    if (local_60 != local_50) {
      operator_delete(local_60);
    }
    return this;
  }
  uVar1 = std::__throw_bad_function_call();
  if (local_78 != &local_68) {
    operator_delete(local_78);
  }
  _Unwind_Resume(uVar1);
}

Assistant:

DiagBuilder &DiagBuilder::operator<<(DiagSentinel b)
{
	WriteRest();

	m_diag.message = m_msg.str();
	m_func(m_diag);

	m_pos = 0;
	m_fmt = NULL;
	m_msg.str("");
	m_diag = Diag();

	return *this;
}